

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBoxPrivate::setCurrentIndex(QComboBoxPrivate *this,QModelIndex *mi)

{
  QPersistentModelIndex *rhs;
  QWidget *this_00;
  QPersistentModelIndexData *pQVar1;
  bool bVar2;
  bool bVar3;
  SelectionBehavior SVar4;
  QCompleter *pQVar5;
  QAbstractItemView *pQVar6;
  QItemSelectionModel *pQVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_90;
  QModelIndex local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::sibling((QModelIndex *)&local_58,mi,mi->r,this->modelColumn);
  if ((((int)local_58 < 0) || ((long)local_58 < 0)) || (local_48.ptr == (QAbstractItemModel *)0x0))
  {
    local_48.ptr = (mi->m).ptr;
    local_58 = *(undefined1 **)mi;
    puStack_50 = (undefined1 *)mi->i;
  }
  rhs = &this->currentIndex;
  bVar2 = ::operator!=((QModelIndex *)&local_58,rhs);
  if (bVar2) {
    QPersistentModelIndex::QPersistentModelIndex
              ((QPersistentModelIndex *)&local_78,(QModelIndex *)&local_58);
    pQVar1 = rhs->d;
    rhs->d = (QPersistentModelIndexData *)local_78._0_8_;
    local_78._0_8_ = pQVar1;
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_78);
  }
  if (this->lineEdit != (QLineEdit *)0x0) {
    local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    itemText((QString *)&local_78,this,(QModelIndex *)&local_58);
    QLineEdit::text((QString *)&local_90,this->lineEdit);
    bVar3 = ::operator!=((QString *)&local_90,(QString *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    if (bVar3) {
      QLineEdit::setText(this->lineEdit,(QString *)&local_78);
      if (this->lineEdit != (QLineEdit *)0x0) {
        pQVar5 = QLineEdit::completer(this->lineEdit);
        if (pQVar5 != (QCompleter *)0x0) {
          pQVar5 = QLineEdit::completer(this->lineEdit);
          QCompleter::setCompletionPrefix(pQVar5,(QString *)&local_78);
        }
      }
    }
    updateLineEditGeometry(this);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  }
  if (((((int)local_58 < 0) || ((long)local_58 < 0)) || (local_48.ptr == (QAbstractItemModel *)0x0))
     && (this->indexBeforeChange != -1)) {
    this->indexBeforeChange = -1;
  }
  else if (!bVar2) goto LAB_003ae1c4;
  pQVar6 = (QAbstractItemView *)QComboBox::view((QComboBox *)this_00);
  SVar4 = QAbstractItemView::selectionBehavior(pQVar6);
  pQVar6 = (QAbstractItemView *)QComboBox::view((QComboBox *)this_00);
  pQVar7 = QAbstractItemView::selectionModel(pQVar6);
  if (pQVar7 != (QItemSelectionModel *)0x0) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,rhs);
    (**(code **)(*(long *)pQVar7 + 0x60))(pQVar7,&local_78,(uint)(SVar4 == SelectRows) << 5 | 3);
  }
  QWidget::update(this_00);
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,rhs);
  emitCurrentIndexChanged(this,&local_78);
LAB_003ae1c4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::setCurrentIndex(const QModelIndex &mi)
{
    Q_Q(QComboBox);

    QModelIndex normalized = mi.sibling(mi.row(), modelColumn); // no-op if mi.column() == modelColumn
    if (!normalized.isValid())
        normalized = mi;    // Fallback to passed index.

    bool indexChanged = (normalized != currentIndex);
    if (indexChanged)
        currentIndex = QPersistentModelIndex(normalized);
    if (lineEdit) {
        const QString newText = itemText(normalized);
        if (lineEdit->text() != newText) {
            lineEdit->setText(newText); // may cause lineEdit -> nullptr (QTBUG-54191)
#if QT_CONFIG(completer)
            if (lineEdit && lineEdit->completer())
                lineEdit->completer()->setCompletionPrefix(newText);
#endif
        }
        updateLineEditGeometry();
    }
    // If the model was reset to an empty one, currentIndex will be invalidated
    // (because it's a QPersistentModelIndex), but the index change will never
    // be advertised. So an explicit check for this condition is needed.
    // The variable used for that check has to be reset when a previously valid
    // index becomes invalid.
    const bool modelResetToEmpty = !normalized.isValid() && indexBeforeChange != -1;
    if (modelResetToEmpty)
        indexBeforeChange = -1;

    if (indexChanged || modelResetToEmpty) {
        QItemSelectionModel::SelectionFlags selectionMode = QItemSelectionModel::ClearAndSelect;
        if (q->view()->selectionBehavior() == QAbstractItemView::SelectRows)
            selectionMode.setFlag(QItemSelectionModel::Rows);
        if (auto *model = q->view()->selectionModel())
            model->setCurrentIndex(currentIndex, selectionMode);

        q->update();
        emitCurrentIndexChanged(currentIndex);
    }
}